

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O2

ion_status_t flat_file_get(ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  ion_fpos_t found_loc;
  ion_flat_file_row_t row;
  
  found_loc = -1;
  if (flat_file->sorted_mode == '\0') {
    uVar3 = 0;
    bVar1 = flat_file_scan(flat_file,-1,&found_loc,&row,'\x01',flat_file_predicate_key_match,key);
    if (bVar1 == 0) {
LAB_00105bdc:
      memcpy(value,row.value,(long)(flat_file->super).record.value_size);
      uVar3 = 0x100000000;
      bVar1 = 0;
      goto LAB_00105bcc;
    }
    if (bVar1 == 0xe) {
      bVar1 = 1;
      goto LAB_00105bcc;
    }
  }
  else {
    bVar1 = flat_file_binary_search(flat_file,key,&found_loc);
    if (bVar1 == 0) {
      bVar1 = flat_file_read_row(flat_file,found_loc,&row);
      if (bVar1 == 0) {
        cVar2 = (*(flat_file->super).compare)(row.key,key,(flat_file->super).record.key_size);
        if (cVar2 == '\0') goto LAB_00105bdc;
        bVar1 = 1;
      }
    }
  }
  uVar3 = 0;
LAB_00105bcc:
  return (ion_status_t)(bVar1 | uVar3);
}

Assistant:

ion_status_t
flat_file_get(
	ion_flat_file_t *flat_file,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_status_t		status		= ION_STATUS_INITIALIZE;
	ion_err_t			err;
	ion_fpos_t			found_loc	= -1;
	ion_flat_file_row_t row;

	if (!flat_file->sorted_mode) {
		err = flat_file_scan(flat_file, -1, &found_loc, &row, ION_FLAT_FILE_SCAN_FORWARDS, flat_file_predicate_key_match, key);

		if (err_ok != err) {
			if (err_file_hit_eof == err) {
				/* Alias the error since in this case, since hitting the EOF signifies */
				/* that we didn't find what we were looking for */
				status.error = err_item_not_found;
			}
			else {
				/* This error takes priority since it is likely a file I/O issue */
				status.error = err;
			}

			return status;
		}
	}
	else {
		err = flat_file_binary_search(flat_file, key, &found_loc);

		if (err_ok != err) {
			status.error = err;
			return status;
		}

		err = flat_file_read_row(flat_file, found_loc, &row);

		if (err_ok != err) {
			status.error = err;
			return status;
		}

		if (0 != flat_file->super.compare(row.key, key, flat_file->super.record.key_size)) {
			status.error = err_item_not_found;
			return status;
		}
	}

	memcpy(value, row.value, flat_file->super.record.value_size);
	status.error	= err_ok;
	status.count	= 1;

	return status;
}